

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O1

QVBoxLayout * __thiscall
Panel::createLayout(Panel *this,array<std::function<void_()>,_3UL> *panelSlots,
                   QMainWindow *mainWindow)

{
  map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>
  *this_00;
  function<void_()> *__x;
  Panel *pPVar1;
  mapped_type *pmVar2;
  QVBoxLayout *pQVar3;
  _Base_ptr p_Var4;
  QGroupBox *pQVar5;
  mapped_type *pmVar6;
  QPushButton *this_01;
  QPushButton *this_02;
  QPushButton *this_03;
  int iVar7;
  _Rb_tree_header *p_Var8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QString local_f8;
  BoardMode local_e0;
  undefined4 uStack_dc;
  char16_t *pcStack_d8;
  qsizetype local_d0;
  QMainWindow *local_c8;
  QGroupBox *local_c0;
  function<void_()> *local_b8;
  Panel *local_b0;
  Object local_a8 [8];
  Object local_a0 [8];
  Object local_98 [8];
  _Any_data local_90;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  local_e0 = NUMERIC;
  local_c8 = mainWindow;
  local_b8 = panelSlots->_M_elems;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[2]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
              *)this,&local_e0,(char (*) [2])0x117c24);
  local_e0 = GRAPHIC;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[2]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
              *)this,&local_e0,(char (*) [2])0x117d16);
  local_e0 = 2;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[2]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
              *)this,&local_e0,(char (*) [2])0x117c58);
  local_e0 = 3;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[2]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
              *)this,&local_e0,(char (*) [2])0x117c72);
  local_e0 = NUMERIC;
  pmVar2 = std::
           map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>
           ::operator[](&this->radioSizeMap,&local_e0);
  QAbstractButton::setChecked(SUB81(pmVar2,0));
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3);
  p_Var4 = (this->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->radioSizeMap)._M_t._M_impl.super__Rb_tree_header;
  local_b0 = this;
  if ((_Rb_tree_header *)p_Var4 != p_Var8) {
    do {
      QBoxLayout::addSpacing((int)pQVar3);
      QBoxLayout::addWidget(pQVar3,&p_Var4[1]._M_parent,0,0);
      QVar9.m_data = (storage_type *)0x10;
      QVar9.m_size = (qsizetype)&local_e0;
      QString::fromUtf8(QVar9);
      local_f8.d.d = (Data *)CONCAT44(uStack_dc,local_e0);
      local_f8.d.ptr = pcStack_d8;
      local_f8.d.size = local_d0;
      QWidget::setStyleSheet((QString *)&p_Var4[1]._M_parent);
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var8);
  }
  QBoxLayout::addSpacing((int)pQVar3);
  pQVar5 = (QGroupBox *)operator_new(0x28);
  QVar10.m_data = (storage_type *)0x12;
  QVar10.m_size = (qsizetype)&local_e0;
  QString::fromUtf8(QVar10);
  local_f8.d.d = (Data *)CONCAT44(uStack_dc,local_e0);
  local_f8.d.ptr = pcStack_d8;
  local_f8.d.size = local_d0;
  QGroupBox::QGroupBox(pQVar5,&local_f8,(QWidget *)local_c8);
  pPVar1 = local_b0;
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
    }
  }
  QWidget::setLayout((QLayout *)pQVar5);
  this_00 = &pPVar1->radioModeMap;
  local_e0 = NUMERIC;
  std::
  _Rb_tree<BoardMode,std::pair<BoardMode_const,QRadioButton>,std::_Select1st<std::pair<BoardMode_const,QRadioButton>>,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
  ::_M_emplace_unique<BoardMode,char_const(&)[8]>
            ((_Rb_tree<BoardMode,std::pair<BoardMode_const,QRadioButton>,std::_Select1st<std::pair<BoardMode_const,QRadioButton>>,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
              *)this_00,&local_e0,(char (*) [8])"Numeric");
  local_e0 = GRAPHIC;
  std::
  _Rb_tree<BoardMode,std::pair<BoardMode_const,QRadioButton>,std::_Select1st<std::pair<BoardMode_const,QRadioButton>>,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
  ::_M_emplace_unique<BoardMode,char_const(&)[8]>
            ((_Rb_tree<BoardMode,std::pair<BoardMode_const,QRadioButton>,std::_Select1st<std::pair<BoardMode_const,QRadioButton>>,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
              *)this_00,&local_e0,(char (*) [8])0x11747d);
  local_e0 = NUMERIC;
  pmVar6 = std::
           map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>
           ::operator[](this_00,&local_e0);
  QAbstractButton::setChecked(SUB81(pmVar6,0));
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3);
  p_Var4 = (pPVar1->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(pPVar1->radioModeMap)._M_t._M_impl.super__Rb_tree_header;
  local_c0 = pQVar5;
  if ((_Rb_tree_header *)p_Var4 != p_Var8) {
    do {
      QBoxLayout::addSpacing((int)pQVar3);
      QBoxLayout::addWidget(pQVar3,&p_Var4[1]._M_parent,0,0);
      QVar11.m_data = (storage_type *)0x10;
      QVar11.m_size = (qsizetype)&local_e0;
      QString::fromUtf8(QVar11);
      local_f8.d.d = (Data *)CONCAT44(uStack_dc,local_e0);
      local_f8.d.ptr = pcStack_d8;
      local_f8.d.size = local_d0;
      QWidget::setStyleSheet((QString *)&p_Var4[1]._M_parent);
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var8);
  }
  QBoxLayout::addSpacing((int)pQVar3);
  pQVar5 = (QGroupBox *)operator_new(0x28);
  QVar12.m_data = (storage_type *)0xd;
  QVar12.m_size = (qsizetype)&local_e0;
  QString::fromUtf8(QVar12);
  local_f8.d.d = (Data *)CONCAT44(uStack_dc,local_e0);
  local_f8.d.ptr = pcStack_d8;
  local_f8.d.size = local_d0;
  QGroupBox::QGroupBox(pQVar5,&local_f8,(QWidget *)local_c8);
  __x = local_b8;
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
    }
  }
  QWidget::setLayout((QLayout *)pQVar5);
  this_01 = (QPushButton *)operator_new(0x28);
  QVar13.m_data = (storage_type *)0xe;
  QVar13.m_size = (qsizetype)&local_e0;
  QString::fromUtf8(QVar13);
  local_f8.d.d = (Data *)CONCAT44(uStack_dc,local_e0);
  local_f8.d.ptr = pcStack_d8;
  local_f8.d.size = local_d0;
  QPushButton::QPushButton(this_01,&local_f8,(QWidget *)local_c8);
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
    }
  }
  QVar14.m_data = (storage_type *)0xb;
  QVar14.m_size = (qsizetype)&local_e0;
  QString::fromUtf8(QVar14);
  local_f8.d.d = (Data *)CONCAT44(uStack_dc,local_e0);
  local_f8.d.ptr = pcStack_d8;
  local_f8.d.size = local_d0;
  QWidget::setStyleSheet((QString *)this_01);
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
    }
  }
  std::function<void_()>::function((function<void_()> *)&local_50,__x);
  QObject::connect<void(QAbstractButton::*)(bool),std::function<void()>>
            (local_98,(offset_in_QAbstractButton_to_subr)this_01,
             (function<void_()> *)QAbstractButton::clicked);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  this_02 = (QPushButton *)operator_new(0x28);
  QVar15.m_data = (storage_type *)0xb;
  QVar15.m_size = (qsizetype)&local_e0;
  QString::fromUtf8(QVar15);
  local_f8.d.d = (Data *)CONCAT44(uStack_dc,local_e0);
  local_f8.d.ptr = pcStack_d8;
  local_f8.d.size = local_d0;
  QPushButton::QPushButton(this_02,&local_f8,(QWidget *)local_c8);
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
    }
  }
  QVar16.m_data = (storage_type *)0xb;
  QVar16.m_size = (qsizetype)&local_e0;
  QString::fromUtf8(QVar16);
  local_f8.d.d = (Data *)CONCAT44(uStack_dc,local_e0);
  local_f8.d.ptr = pcStack_d8;
  local_f8.d.size = local_d0;
  QWidget::setStyleSheet((QString *)this_02);
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
    }
  }
  std::function<void_()>::function((function<void_()> *)&local_70,__x + 1);
  QObject::connect<void(QAbstractButton::*)(bool),std::function<void()>>
            (local_a0,(offset_in_QAbstractButton_to_subr)this_02,
             (function<void_()> *)QAbstractButton::clicked);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  this_03 = (QPushButton *)operator_new(0x28);
  QVar17.m_data = (storage_type *)0x9;
  QVar17.m_size = (qsizetype)&local_e0;
  QString::fromUtf8(QVar17);
  local_f8.d.d = (Data *)CONCAT44(uStack_dc,local_e0);
  local_f8.d.ptr = pcStack_d8;
  local_f8.d.size = local_d0;
  QPushButton::QPushButton(this_03,&local_f8,(QWidget *)local_c8);
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
    }
  }
  QVar18.m_data = (storage_type *)0xb;
  QVar18.m_size = (qsizetype)&local_e0;
  QString::fromUtf8(QVar18);
  local_f8.d.d = (Data *)CONCAT44(uStack_dc,local_e0);
  local_f8.d.ptr = pcStack_d8;
  local_f8.d.size = local_d0;
  QWidget::setStyleSheet((QString *)this_03);
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
    }
  }
  std::function<void_()>::function((function<void_()> *)&local_90,__x + 2);
  QObject::connect<void(QAbstractButton::*)(bool),std::function<void()>>
            (local_a8,(offset_in_QAbstractButton_to_subr)this_03,
             (function<void_()> *)QAbstractButton::clicked);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3);
  iVar7 = (int)pQVar3;
  QLayout::setContentsMargins(iVar7,0x1e,0,0x14);
  QBoxLayout::addWidget(pQVar3,this_01,0,0);
  QBoxLayout::addSpacing(iVar7);
  QBoxLayout::addWidget(pQVar3,this_02,0,0);
  QBoxLayout::addSpacing(iVar7);
  QBoxLayout::addWidget(pQVar3,this_03,0,0);
  QBoxLayout::addSpacing(iVar7);
  QBoxLayout::addWidget(pQVar3,local_c0,0,0);
  QBoxLayout::addStretch(iVar7);
  QBoxLayout::addWidget(pQVar3,pQVar5,0,0);
  QBoxLayout::addStretch(iVar7);
  return pQVar3;
}

Assistant:

QVBoxLayout* Panel::createLayout( std::array<std::function<void()>, 3>& panelSlots, QMainWindow* mainWindow )
{
    radioSizeMap.emplace( BoardSize::FOUR, "4" );
    radioSizeMap.emplace( BoardSize::FIVE, "5" );
    radioSizeMap.emplace( BoardSize::SIX, "6" );
    radioSizeMap.emplace( BoardSize::SEVEN, "7" );
    radioSizeMap[BoardSize::FOUR].setChecked( true );

    QVBoxLayout* radioSizeLayout = new QVBoxLayout();
    for( auto& radio : radioSizeMap | std::views::values )
    {
        radioSizeLayout->addSpacing( 10 );
        radioSizeLayout->addWidget( &radio );
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
    }
    radioSizeLayout->addSpacing( 30 );

    QGroupBox* radioSizeBox = new QGroupBox( "Dimension of Board", mainWindow );
    radioSizeBox->setLayout( radioSizeLayout );

    radioModeMap.emplace( BoardMode::NUMERIC, "Numeric" );
    radioModeMap.emplace( BoardMode::GRAPHIC, "Graphic" );
    radioModeMap[BoardMode::NUMERIC].setChecked( true );

    QVBoxLayout* radioModeLayout = new QVBoxLayout();
    for( auto& radio : radioModeMap | std::views::values )
    {
        radioModeLayout->addSpacing( 10 );
        radioModeLayout->addWidget( &radio );
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
    }
    radioModeLayout->addSpacing( 30 );

    QGroupBox* radioModeBox = new QGroupBox( "Kind of Board", mainWindow );
    radioModeBox->setLayout( radioModeLayout );

    QPushButton* pushRandom = new QPushButton( "Generate Board", mainWindow );
    pushRandom->setStyleSheet( STYLE_HEIGHT );
    QObject::connect( pushRandom, &QPushButton::clicked, panelSlots[0] );

    QPushButton* pushSolve = new QPushButton( "Solve Board", mainWindow );
    pushSolve->setStyleSheet( STYLE_HEIGHT );
    QObject::connect( pushSolve, &QPushButton::clicked, panelSlots[1] );

    QPushButton* pushUndo = new QPushButton( "Undo Move", mainWindow );
    pushUndo->setStyleSheet( STYLE_HEIGHT );
    QObject::connect( pushUndo, &QPushButton::clicked, panelSlots[2] );

    QVBoxLayout* panelLayout = new QVBoxLayout();
    panelLayout->setContentsMargins( 30, 0, 20, 0 );
    panelLayout->addWidget( pushRandom );
    panelLayout->addSpacing( 15 );
    panelLayout->addWidget( pushSolve );
    panelLayout->addSpacing( 15 );
    panelLayout->addWidget( pushUndo );
    panelLayout->addSpacing( 30 );
    panelLayout->addWidget( radioSizeBox );
    panelLayout->addStretch();
    panelLayout->addWidget( radioModeBox );
    panelLayout->addStretch();
    return panelLayout;
}